

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_formats.c
# Opt level: O0

FMformat_order FMformat_cmp(FMFormat_conflict format1,FMFormat_conflict format2)

{
  int iVar1;
  FMformat_order FVar2;
  FMFieldList p_Var3;
  FMFieldList __base;
  char *__s2;
  FMFormat_conflict in_RSI;
  FMFormat_conflict in_RDI;
  FMformat_order sub_result;
  int i_1;
  char *sub1_name;
  int name_cmp;
  int limit;
  int j;
  int i;
  int field_count2;
  int field_count1;
  FMFormat_conflict *tmp_subformats;
  FMFormat_conflict *subformats2;
  FMFormat_conflict *subformats1;
  FMFieldList field_list2;
  FMFieldList field_list1;
  FMformat_order tmp_result;
  FMFieldList in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  int iVar4;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  FMFormat_conflict *local_48;
  FMFormat_conflict *local_40;
  FMFormat_conflict *local_38;
  undefined4 in_stack_ffffffffffffffe0;
  FMformat_order FVar5;
  FMformat_order FVar6;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  FVar5 = Format_Equal;
  field_list_of_IOformat(in_RDI);
  p_Var3 = copy_field_list((FMFieldList)
                           CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  field_list_of_IOformat(in_RSI);
  __base = copy_field_list((FMFieldList)
                           CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  local_40 = (FMFormat_conflict *)0x0;
  local_48 = (FMFormat_conflict *)0x0;
  local_4c = 0;
  while (p_Var3[local_4c].field_name != (char *)0x0) {
    local_4c = local_4c + 1;
  }
  local_50 = 0;
  while (__base[local_50].field_name != (char *)0x0) {
    local_50 = local_50 + 1;
  }
  qsort(p_Var3,(long)local_4c,0x18,field_name_compar);
  qsort(__base,(long)local_50,0x18,field_name_compar);
  local_58 = 0;
  for (local_54 = 0; local_54 < local_4c && local_58 < local_50; local_54 = local_54 + 1) {
    iVar4 = strcmp(p_Var3[local_54].field_name,__base[local_58].field_name);
    if (iVar4 == 0) {
      iVar4 = field_type_eq((char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                            (char *)in_RDI);
      if (iVar4 == 0) {
        return Format_Incompatible;
      }
    }
    else {
      if (iVar4 < 0) {
        if (FVar5 == Format_Less) {
          FVar5 = Format_Incompatible;
          goto LAB_0012d1a4;
        }
        FVar5 = Format_Greater;
        while (iVar4 = strcmp(p_Var3[local_54].field_name,__base[local_58].field_name), iVar4 < 0) {
          local_54 = local_54 + 1;
          if (local_54 == local_4c) {
            FVar5 = Format_Incompatible;
            goto LAB_0012d1a4;
          }
        }
      }
      else {
        if (FVar5 == Format_Greater) {
          FVar5 = Format_Incompatible;
          goto LAB_0012d1a4;
        }
        FVar5 = Format_Less;
        while (iVar4 = strcmp(p_Var3[local_54].field_name,__base[local_58].field_name), 0 < iVar4) {
          local_58 = local_58 + 1;
          if (local_58 == local_50) {
            FVar5 = Format_Incompatible;
            goto LAB_0012d1a4;
          }
        }
      }
      local_54 = local_54 + -1;
      local_58 = local_58 + -1;
    }
    local_58 = local_58 + 1;
  }
  if (local_54 < local_4c) {
    if (FVar5 == Format_Less) {
      FVar5 = Format_Incompatible;
      goto LAB_0012d1a4;
    }
    FVar5 = Format_Greater;
  }
  else if (local_58 < local_50) {
    if (FVar5 == Format_Greater) {
      FVar5 = Format_Incompatible;
      goto LAB_0012d1a4;
    }
    FVar5 = Format_Less;
  }
  local_48 = get_subformats_IOformat
                       ((FMFormat_conflict)
                        CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  local_40 = get_subformats_IOformat
                       ((FMFormat_conflict)
                        CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  local_38 = local_48;
  while (*local_38 != (FMFormat_conflict)0x0) {
    p_Var3 = (FMFieldList)name_of_FMformat(*local_38);
    iVar4 = 0;
    FVar6 = FVar5;
    if (*local_38 == in_RDI) {
      local_38 = local_38 + 1;
    }
    else {
      for (; FVar5 = FVar6, local_40[iVar4] != (FMFormat_conflict)0x0; iVar4 = iVar4 + 1) {
        in_stack_ffffffffffffff80 = p_Var3;
        __s2 = name_of_FMformat(local_40[iVar4]);
        iVar1 = strcmp((char *)in_stack_ffffffffffffff80,__s2);
        if (iVar1 == 0) {
          FVar2 = FMformat_cmp(in_RSI,(FMFormat_conflict)CONCAT44(FVar6,in_stack_ffffffffffffffe0));
          if (FVar2 == Format_Incompatible) {
            FVar5 = Format_Incompatible;
            goto LAB_0012d1a4;
          }
          FVar5 = FVar6;
          if (((FVar2 != Format_Equal) && (FVar5 = FVar2, FVar6 != Format_Equal)) &&
             (FVar5 = FVar6, FVar6 != FVar2)) {
            FVar5 = Format_Incompatible;
            goto LAB_0012d1a4;
          }
          break;
        }
      }
      local_38 = local_38 + 1;
    }
  }
LAB_0012d1a4:
  free_field_list(in_stack_ffffffffffffff80);
  free_field_list(in_stack_ffffffffffffff80);
  if (local_48 != (FMFormat_conflict *)0x0) {
    free(local_48);
  }
  if (local_40 != (FMFormat_conflict *)0x0) {
    free(local_40);
  }
  return FVar5;
}

Assistant:

FMformat_order
FMformat_cmp(FMFormat format1, FMFormat format2)
{
    FMformat_order tmp_result = Format_Equal;
    FMFieldList field_list1 =
	copy_field_list(field_list_of_IOformat(format1));
    FMFieldList field_list2 =
	copy_field_list(field_list_of_IOformat(format2));
    FMFormat *subformats1 = NULL, *subformats2 = NULL, *tmp_subformats = NULL;
    int field_count1, field_count2;
    int i, j, limit;

    /* count fields */
    for (field_count1 = 0; field_list1[field_count1].field_name != NULL;
	 field_count1++);

    /* count fields */
    for (field_count2 = 0; field_list2[field_count2].field_name != NULL;
	 field_count2++);

    qsort(field_list1, field_count1, sizeof(FMField), field_name_compar);
    qsort(field_list2, field_count2, sizeof(FMField), field_name_compar);

    limit = field_count1;
    if (field_count2 < limit)
	limit = field_count2;
    i = j = 0;
    while ((i < field_count1) && (j < field_count2)) {
	int name_cmp;
	if ((name_cmp = strcmp(field_list1[i].field_name,
			       field_list2[j].field_name)) == 0) {
	    /* fields have same name */
	    if (!field_type_eq(field_list1[i].field_type,
				  field_list2[j].field_type)) {
		return Format_Incompatible;
	    }
	} else if (name_cmp < 0) {
	    /* name_cmp>0  a field in field_list1 that doesn't appear in 2 */
	    if (tmp_result == Format_Less) {
		/* we previously found the opposite */
		tmp_result = Format_Incompatible;
		goto free_lists;
	    } else {
		/* tentatively decide that list1 is a superset of 2 */
		tmp_result = Format_Greater;
	    }
	    /* skip fields in 1 until we find the next field in 2 */
	    while (strcmp(field_list1[i].field_name,
			  field_list2[j].field_name) < 0) {
		i++;
		if (i == field_count1) {
		    /* didn't find one */
		    tmp_result = Format_Incompatible;
		    goto free_lists;
		}
	    }
	    i--;
	    j--;
	} else {
	    /* name_cmp>0  a field in field_list2 that doesn't appear in 1 */
	    if (tmp_result == Format_Greater) {
		tmp_result = Format_Incompatible;
		goto free_lists;
	    } else {
		tmp_result = Format_Less;
	    }
	    /* skip fields in field_list2 until we find matching */
	    while (strcmp(field_list1[i].field_name,
			  field_list2[j].field_name) > 0) {
		j++;
		if (j == field_count2) {
		    /* didn't find one */
		    tmp_result = Format_Incompatible;
		    goto free_lists;
		}
	    }
	    i--;
	    j--;
	}
	i++;
	j++;
    }
    if (i < field_count1) {
	if (tmp_result == Format_Less) {
	    tmp_result = Format_Incompatible;
	    goto free_lists;
	} else {
	    tmp_result = Format_Greater;
	}
    } else if (j < field_count2) {
	if (tmp_result == Format_Greater) {
	    tmp_result = Format_Incompatible;
	    goto free_lists;
	} else {
	    tmp_result = Format_Less;
	}
    }
    /* go through subformats */
    tmp_subformats = subformats1 = get_subformats_IOformat(format1);
    subformats2 = get_subformats_IOformat(format2);

    while (*subformats1 != NULL) {
	char *sub1_name = name_of_FMformat(*subformats1);
	int i = 0;
	if (*subformats1 == format1) {
	    /* self appears in subformat list, skip it */
	    subformats1++;
	    continue;
	}
	while (subformats2[i] != NULL) {
	    if (strcmp(sub1_name, name_of_FMformat(subformats2[i])) == 0) {
		/* same name, compare */
		FMformat_order sub_result;
		sub_result = FMformat_cmp(*subformats1,
					  subformats2[i]);
		if (sub_result == Format_Incompatible) {
		    tmp_result = Format_Incompatible;
		    goto free_lists;
		}
		if (sub_result != Format_Equal) {
		    /* subformats are not equal! */
		    if (tmp_result == Format_Equal) {
			/* we thought they were equal before */
			tmp_result = sub_result;
		    } else if (tmp_result != sub_result) {
			tmp_result = Format_Incompatible;
			goto free_lists;
		    }
		}
		break;
	    }
	    i++;
	}
	subformats1++;
    }

 free_lists:
    free_field_list(field_list1);
    free_field_list(field_list2);
    if (tmp_subformats) free(tmp_subformats);
    if (subformats2) free(subformats2);
    return tmp_result;
}